

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication.c
# Opt level: O3

int decode(uchar *src,int len,uchar *dst,int buf_max)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  if (len < 1) {
    return 0;
  }
  uVar5 = 0;
  iVar2 = 0;
  iVar4 = 0;
  iVar6 = 0;
  uVar7 = 0;
  uVar3 = 0;
  do {
    bVar1 = src[uVar5];
    if (bVar1 >= 0x40) {
      uVar7 = bVar1 - 0x40;
    }
    iVar2 = iVar2 + (uint)(bVar1 < 0x40);
    uVar3 = (uVar7 & 0xffff) << (10U - (char)iVar6 & 0x1f) | uVar3;
    if (iVar6 < 2) {
      iVar6 = iVar6 + 6;
    }
    else {
      dst[iVar4] = (uchar)(uVar3 >> 8);
      iVar4 = iVar4 + 1;
      if (buf_max <= iVar4) {
        return 0;
      }
      iVar6 = iVar6 + -2;
      uVar3 = (uVar3 & 0xffff) << 8;
    }
    uVar5 = uVar5 + 1;
  } while ((uint)len != uVar5);
  iVar6 = -iVar2;
  if (iVar2 == 0) {
    iVar6 = iVar4;
  }
  return iVar6;
}

Assistant:

int decode(const unsigned char* src, int len, unsigned char* dst, int buf_max)
{
  unsigned short dat, b;
  int pos, s_pos, w_pos;
  int rerr;
  pos = 0;    // read position
  w_pos = 0;  // write_position
  s_pos = 0;  // shift position
  rerr = 0;
  dat = 0;
  b = 0;
  while (pos < len)
  {
    if (src[pos] >= 0x40)
      b = src[pos] - 0x40;
    else
      rerr++;

    dat |= (b << (10 - s_pos));
    s_pos += 6;
    if (s_pos >= 8)
    {
      dst[w_pos] = (dat >> 8);
      w_pos++;
      if (w_pos >= buf_max)
        return 0;
      s_pos -= 8;
      dat = dat << 8;
    }
    pos++;
  }

  if (rerr)
    return -rerr;
  return w_pos;
}